

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.cpp
# Opt level: O0

void wallet::UnloadWallets(WalletContext *context)

{
  long lVar1;
  bool bVar2;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  _Optional_payload_base<bool> in_stack_0000000e;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  value_type wallet;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  wallets;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_ffffffffffffff68;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *in_stack_ffffffffffffff78;
  WalletContext *in_stack_ffffffffffffff90;
  optional<bool> local_4a [13];
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_ffffffffffffffd0;
  shared_ptr<wallet::CWallet> *in_stack_ffffffffffffffd8;
  WalletContext *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetWallets(in_stack_ffffffffffffff90);
  while( true ) {
    bVar2 = std::
            vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
            ::empty((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                     *)in_stack_ffffffffffffff78);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    back((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
          *)in_stack_ffffffffffffff68);
    _GLOBAL__N_1::std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffff68,
               (shared_ptr<wallet::CWallet> *)0x9bc8d6);
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    pop_back((vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
              *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff78 = in_RDI;
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector(in_stack_ffffffffffffff68);
    in_RDI = in_stack_ffffffffffffff78;
    std::optional<bool>::optional(local_4a);
    RemoveWallet(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 (optional<bool>)in_stack_0000000e,in_stack_ffffffffffffffd0);
    WaitForDeleteWallet((shared_ptr<wallet::CWallet> *)in_RDI);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_ffffffffffffff78);
    _GLOBAL__N_1::std::shared_ptr<wallet::CWallet>::~shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_ffffffffffffff68);
  }
  _GLOBAL__N_1::std::
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
  ~vector(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnloadWallets(WalletContext& context)
{
    auto wallets = GetWallets(context);
    while (!wallets.empty()) {
        auto wallet = wallets.back();
        wallets.pop_back();
        std::vector<bilingual_str> warnings;
        RemoveWallet(context, wallet, /* load_on_start= */ std::nullopt, warnings);
        WaitForDeleteWallet(std::move(wallet));
    }
}